

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O0

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
getMomentaDotFromForces(IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u)

{
  Matrix3 *other;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pDVar1;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RCX;
  Index extraout_RDX;
  Vector VVar2;
  Type local_5b0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_580;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_570;
  Vector3 local_550;
  Matrix3 local_538;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_4f0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_4d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_4a8;
  Type local_470;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_440;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_410;
  Type local_3d0;
  Type local_3a0;
  EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> local_370 [48]
  ;
  Matrix<double,__1,__1,_0,__1,__1> local_340;
  EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> local_328 [48]
  ;
  Matrix<double,__1,__1,_0,__1,__1> local_2f8;
  uint local_2e0;
  uint local_2dc;
  uint i_2;
  uint nbContacts;
  Scalar local_2a8;
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_2a0 [56];
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_268;
  Type local_248;
  Type local_218;
  Type local_1e8;
  Type local_1b8;
  uint local_184;
  undefined1 local_180 [4];
  int i_1;
  Type local_148;
  EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_100 [56];
  Matrix<double,__1,__1,_0,__1,__1> local_c8;
  uint local_ac;
  undefined1 local_a8 [4];
  int i;
  Type local_70;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_38;
  Vector *u_local;
  Vector *x_local;
  IMUElasticLocalFrameDynamicalSystem *this_local;
  
  local_38 = in_RCX;
  u_local = u;
  x_local = x;
  this_local = this;
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  DynamicalSystemFunctorBase::assertInputVector_((DynamicalSystemFunctorBase *)x,(Vector *)local_38)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_70,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x4a),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_70);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)local_a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)local_a8);
  other = computeRotation_((IMUElasticLocalFrameDynamicalSystem *)x,
                           (Vector3 *)
                           &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows,0);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,other);
  for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)local_100,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,
               (ulong)(local_ac * 6 + 0xc),6);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_c8,local_100);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)(x + 0xc1),(Matrix *)&local_c8,local_ac);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_c8);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_148,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0x18,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0xcb),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_148);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)local_180,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0x1b,3)
  ;
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)local_180);
  for (local_184 = 0; local_184 < 2; local_184 = local_184 + 1) {
    pDVar1 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 0xc1),local_184);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>(&local_1b8,pDVar1,0,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_1e8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(long)(int)(local_184 * 3),3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_1e8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
               &local_1b8);
    pDVar1 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 0xc1),local_184);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>(&local_218,pDVar1,3,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_248,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(long)(int)(local_184 * 3),3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_248,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
               &local_218);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)local_2a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0x1e,2)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::operator<<
            (&local_268,(DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)(x + 0x53),local_2a0);
  local_2a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(&local_268,&local_2a8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_268);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>((Type *)&i_2,local_38,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&i_2);
  if ((x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
      0x10000000000) != 0) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x53));
  }
  local_2dc = getContactsNumber((IMUElasticLocalFrameDynamicalSystem *)x);
  for (local_2e0 = 0; local_2e0 < local_2dc; local_2e0 = local_2e0 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              ((Type *)local_328,local_38,(ulong)(local_2e0 * 0xc + 0x30),3);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_2f8,local_328);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)(x + 0xa2),(Matrix *)&local_2f8,local_2e0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2f8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              ((Type *)local_370,local_38,(ulong)(local_2e0 * 0xc + 0x33),3);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_340,local_370);
    IndexedMatrixArray::setValue
              ((IndexedMatrixArray *)
               &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(Matrix *)&local_340,local_2e0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_340);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_3a0,local_38,0x2a,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&local_3a0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_3d0,local_38,0x2d,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0xf2),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_3d0);
  computeContactWrench
            ((IMUElasticLocalFrameDynamicalSystem *)x,
             (Matrix3 *)
             &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Vector3 *)(x + 0x4a),(IndexedMatrixArray *)(x + 0xa2),
             (IndexedMatrixArray *)
             &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Vector *)
                     &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,
             (Vector *)
             &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Vector3 *)(x + 0xcb),
             (Vector3 *)
             &x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Vector3 *)
                     &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,(Vector3 *)(x + 0xf2));
  Eigen::operator*(&local_440,(double *)&hrp2::m,(StorageBaseType *)cst::gravity);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_410,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             &x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_440);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::segment<3>
            (&local_470,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(x + 0x47),0,3);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false> *)&local_470,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_410);
  local_580 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                         &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
  operator+(&local_570,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
             *)&local_580,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x4a));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,3,1,0,3,1> *)&local_550,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_570);
  kine::skewSymmetric(&local_538,&local_550);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (&local_4f0,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_538,(double *)&hrp2::m
            );
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
  ::operator*(&local_4d0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
               *)&local_4f0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)cst::gravity);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_4a8,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             &x[0xc9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                      *)&local_4d0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::segment<3>
            (&local_5b0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(x + 0x47),3,3);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false> *)&local_5b0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
              *)&local_4a8);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(x + 0x47));
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::getMomentaDotFromForces(const Vector& x, const Vector& u)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        // Getting flexibility
        op_.positionFlex=x.segment(state::pos,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.rFlex = computeRotation_(op_.orientationFlexV,0);

        // Getting contact forces
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts.setValue(x.segment(state::fc+6*i,6),i);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        // Getting CoM
        op_.positionComBias <<  x.segment(state::comBias,2),
                                0;// the bias of the com along the z axis is assumed 0.
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;


        // Getting contact positions
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
          // Positions
          op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
          op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        computeContactWrench(op_.rFlex, op_.positionFlex, op_.contactPosV, op_.contactOriV,
                             fc_, tc_, op_.fm, op_.tm, op_.addForce, op_.addMoment);


        op_.momentaDot.segment<3>(0) = op_.f - hrp2::m*cst::gravity;
        op_.momentaDot.segment<3>(3) = op_.t - kine::skewSymmetric(op_.rFlex*op_.positionCom+op_.positionFlex)*hrp2::m*cst::gravity;

        return op_.momentaDot;
    }